

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

list * __thiscall DataGroup_PY::getNamedEntries_PY(list *__return_storage_ptr__,DataGroup_PY *this)

{
  bool bVar1;
  vector<DL::Data,_std::allocator<DL::Data>_> *__x;
  reference pDVar2;
  Data_PY local_120;
  undefined1 local_c0 [8];
  Data v;
  iterator __end1;
  iterator __begin1;
  vector_t<Data> *__range1;
  undefined1 local_30 [8];
  vector_t<Data> l;
  DataGroup_PY *this_local;
  list *pyl;
  
  l.super__Vector_base<DL::Data,_std::allocator<DL::Data>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  __x = (vector<DL::Data,_std::allocator<DL::Data>_> *)DL::DataGroup::getNamedEntries();
  std::vector<DL::Data,_std::allocator<DL::Data>_>::vector
            ((vector<DL::Data,_std::allocator<DL::Data>_> *)local_30,__x);
  boost::python::list::list(__return_storage_ptr__);
  __end1 = std::vector<DL::Data,_std::allocator<DL::Data>_>::begin
                     ((vector<DL::Data,_std::allocator<DL::Data>_> *)local_30);
  v._88_8_ = std::vector<DL::Data,_std::allocator<DL::Data>_>::end
                       ((vector<DL::Data,_std::allocator<DL::Data>_> *)local_30);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<DL::Data_*,_std::vector<DL::Data,_std::allocator<DL::Data>_>_>
                                     *)&v.field_0x58), bVar1) {
    pDVar2 = __gnu_cxx::
             __normal_iterator<DL::Data_*,_std::vector<DL::Data,_std::allocator<DL::Data>_>_>::
             operator*(&__end1);
    DL::Data::Data((Data *)local_c0,pDVar2);
    Data_PY::Data_PY(&local_120,(Data *)local_c0);
    boost::python::list::append<Data_PY>(__return_storage_ptr__,&local_120);
    Data_PY::~Data_PY(&local_120);
    DL::Data::~Data((Data *)local_c0);
    __gnu_cxx::__normal_iterator<DL::Data_*,_std::vector<DL::Data,_std::allocator<DL::Data>_>_>::
    operator++(&__end1);
  }
  std::vector<DL::Data,_std::allocator<DL::Data>_>::~vector
            ((vector<DL::Data,_std::allocator<DL::Data>_> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

bpy::list getNamedEntries_PY() const
	{
		auto l = getNamedEntries();
		bpy::list pyl;
		for (auto v : l)
			pyl.append(Data_PY(v));
		return pyl;
	}